

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.cpp
# Opt level: O2

NodeRecord * __thiscall
embree::sse2::CreateMortonLeaf<4,_embree::TriangleM<4>_>::operator()
          (NodeRecord *__return_storage_ptr__,CreateMortonLeaf<4,_embree::TriangleM<4>_> *this,
          range<unsigned_int> *current,CachedAllocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  FastAllocator *this_00;
  ThreadLocal *pTVar9;
  ThreadLocal2 *this_01;
  TriangleMesh *pTVar10;
  BuildPrim *pBVar11;
  long lVar12;
  char *pcVar13;
  MutexSys *pMVar14;
  undefined8 uVar15;
  ulong uVar16;
  float *pfVar17;
  size_t sVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar22;
  undefined1 auVar23 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  vuint4 vgeomID;
  undefined1 local_d8 [8];
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [8];
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [8];
  float fStack_a0;
  float fStack_9c;
  undefined1 local_98 [8];
  float fStack_90;
  float fStack_8c;
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  vuint4 vprimID;
  
  uVar5 = current->_begin;
  uVar6 = current->_end;
  this_00 = alloc->alloc;
  pTVar9 = alloc->talloc1;
  vgeomID.field_0.v[0] = 0xb0;
  this_01 = pTVar9->parent;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    fStack_a0._0_1_ = true;
    local_a8 = (undefined1  [8])this_01;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_78 = (undefined1  [8])this_01;
    fStack_d0._0_1_ = true;
    local_d8 = (undefined1  [8])&FastAllocator::s_thread_local_allocators_lock;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&this_00->thread_local_allocators,(value_type *)local_78);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)local_d8);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)local_a8);
  }
  uVar15 = vgeomID.field_0.v[0];
  pTVar9->bytesUsed = pTVar9->bytesUsed + vgeomID.field_0.v[0];
  sVar18 = pTVar9->cur;
  uVar19 = (ulong)(-(int)sVar18 & 0xf);
  uVar16 = sVar18 + vgeomID.field_0.v[0] + uVar19;
  pTVar9->cur = uVar16;
  if (pTVar9->end < uVar16) {
    pTVar9->cur = sVar18;
    pMVar14 = (MutexSys *)pTVar9->allocBlockSize;
    if ((MutexSys *)(vgeomID.field_0.v[0] * 4) < pMVar14 ||
        (long)(vgeomID.field_0.v[0] * 4) - (long)pMVar14 == 0) {
      local_d8 = (undefined1  [8])pMVar14;
      pfVar17 = (float *)FastAllocator::malloc(this_00,(size_t)local_d8);
      pTVar9->ptr = (char *)pfVar17;
      sVar18 = (pTVar9->end - pTVar9->cur) + pTVar9->bytesWasted;
      pTVar9->bytesWasted = sVar18;
      pTVar9->end = (size_t)local_d8;
      pTVar9->cur = uVar15;
      if ((ulong)local_d8 < (ulong)uVar15) {
        pTVar9->cur = 0;
        local_d8 = (undefined1  [8])pTVar9->allocBlockSize;
        pfVar17 = (float *)FastAllocator::malloc(this_00,(size_t)local_d8);
        pTVar9->ptr = (char *)pfVar17;
        sVar18 = (pTVar9->end - pTVar9->cur) + pTVar9->bytesWasted;
        pTVar9->bytesWasted = sVar18;
        pTVar9->end = (size_t)local_d8;
        pTVar9->cur = uVar15;
        if ((ulong)local_d8 < (ulong)uVar15) {
          pTVar9->cur = 0;
          pfVar17 = (float *)0x0;
          goto LAB_00452168;
        }
      }
      pTVar9->bytesWasted = sVar18;
    }
    else {
      pfVar17 = (float *)FastAllocator::malloc(this_00,(size_t)&vgeomID);
    }
  }
  else {
    pTVar9->bytesWasted = pTVar9->bytesWasted + uVar19;
    pfVar17 = (float *)(pTVar9->ptr + (uVar16 - vgeomID.field_0._0_8_));
  }
LAB_00452168:
  vgeomID.field_0.v[0] = -1;
  vgeomID.field_0.i[2] = 0xffffffff;
  vgeomID.field_0.i[3] = 0xffffffff;
  vprimID.field_0.i[0] = 0xffffffff;
  vprimID.field_0.i[1] = 0xffffffff;
  vprimID.field_0.i[2] = 0xffffffff;
  vprimID.field_0.i[3] = 0xffffffff;
  _local_b8 = (undefined1  [16])0x0;
  _local_c8 = (undefined1  [16])0x0;
  local_d8 = (undefined1  [8])0x0;
  fStack_d0._0_1_ = false;
  stack0xffffffffffffff31 = 0;
  _local_88 = (undefined1  [16])0x0;
  _local_98 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [8])0x0;
  fStack_a0._0_1_ = false;
  stack0xffffffffffffff61 = 0;
  _local_58 = (undefined1  [16])0x0;
  _local_68 = (undefined1  [16])0x0;
  _local_78 = (undefined1  [16])0x0;
  pTVar10 = this->mesh;
  pBVar11 = this->morton;
  uVar7 = this->geomID_;
  aVar22 = _DAT_01f45a40;
  auVar23 = _DAT_01f45a30;
  for (lVar20 = 0; (ulong)(uVar6 - uVar5) << 2 != lVar20; lVar20 = lVar20 + 4) {
    uVar8 = *(uint *)((long)&pBVar11[uVar5].field_0 + lVar20 * 2 + 4);
    lVar21 = (ulong)uVar8 * *(long *)&pTVar10->field_0x68;
    lVar12 = *(long *)&(pTVar10->super_Geometry).field_0x58;
    pcVar13 = (pTVar10->vertices0).super_RawBufferView.ptr_ofs;
    sVar18 = (pTVar10->vertices0).super_RawBufferView.stride;
    auVar2 = *(undefined1 (*) [16])(pcVar13 + *(uint *)(lVar12 + lVar21) * sVar18);
    auVar3 = *(undefined1 (*) [16])(pcVar13 + *(uint *)(lVar12 + 4 + lVar21) * sVar18);
    auVar4 = *(undefined1 (*) [16])(pcVar13 + *(uint *)(lVar12 + 8 + lVar21) * sVar18);
    auVar23 = minps(auVar23,auVar2);
    auVar25 = minps(auVar3,auVar4);
    auVar23 = minps(auVar23,auVar25);
    auVar25 = maxps((undefined1  [16])aVar22,auVar2);
    auVar26 = maxps(auVar3,auVar4);
    aVar22 = (anon_union_16_2_47237d3f_for_Vec3fx_0)maxps(auVar25,auVar26);
    *(uint *)(local_d8 + lVar20 + -0x10) = uVar7;
    *(uint *)((long)&vprimID.field_0 + lVar20) = uVar8;
    *(int *)(local_d8 + lVar20) = auVar2._0_4_;
    *(int *)(local_c8 + lVar20) = auVar2._4_4_;
    *(int *)(local_b8 + lVar20) = auVar2._8_4_;
    *(int *)(local_a8 + lVar20) = auVar3._0_4_;
    *(int *)(local_98 + lVar20) = auVar3._4_4_;
    *(int *)(local_88 + lVar20) = auVar3._8_4_;
    *(int *)(local_78 + lVar20) = auVar4._0_4_;
    *(int *)(local_68 + lVar20) = auVar4._4_4_;
    *(int *)(local_58 + lVar20) = auVar4._8_4_;
  }
  *pfVar17 = (float)local_d8._0_4_;
  pfVar17[1] = (float)local_d8._4_4_;
  pfVar17[2] = fStack_d0;
  pfVar17[3] = fStack_cc;
  pfVar17[4] = (float)local_c8._0_4_;
  pfVar17[5] = (float)local_c8._4_4_;
  pfVar17[6] = fStack_c0;
  pfVar17[7] = fStack_bc;
  pfVar17[8] = (float)local_b8._0_4_;
  pfVar17[9] = (float)local_b8._4_4_;
  pfVar17[10] = fStack_b0;
  pfVar17[0xb] = fStack_ac;
  pfVar17[0xc] = (float)local_d8._0_4_ - (float)local_a8._0_4_;
  pfVar17[0xd] = (float)local_d8._4_4_ - (float)local_a8._4_4_;
  pfVar17[0xe] = fStack_d0 - fStack_a0;
  pfVar17[0xf] = fStack_cc - fStack_9c;
  pfVar17[0x10] = (float)local_c8._0_4_ - (float)local_98._0_4_;
  pfVar17[0x11] = (float)local_c8._4_4_ - (float)local_98._4_4_;
  pfVar17[0x12] = fStack_c0 - fStack_90;
  pfVar17[0x13] = fStack_bc - fStack_8c;
  pfVar17[0x14] = (float)local_b8._0_4_ - (float)local_88._0_4_;
  pfVar17[0x15] = (float)local_b8._4_4_ - (float)local_88._4_4_;
  pfVar17[0x16] = fStack_b0 - fStack_80;
  pfVar17[0x17] = fStack_ac - fStack_7c;
  pfVar17[0x18] = (float)local_78._0_4_ - (float)local_d8._0_4_;
  pfVar17[0x19] = (float)local_78._4_4_ - (float)local_d8._4_4_;
  pfVar17[0x1a] = fStack_70 - fStack_d0;
  pfVar17[0x1b] = fStack_6c - fStack_cc;
  pfVar17[0x1c] = (float)local_68._0_4_ - (float)local_c8._0_4_;
  pfVar17[0x1d] = (float)local_68._4_4_ - (float)local_c8._4_4_;
  pfVar17[0x1e] = fStack_60 - fStack_c0;
  pfVar17[0x1f] = fStack_5c - fStack_bc;
  pfVar17[0x20] = (float)local_58._0_4_ - (float)local_b8._0_4_;
  pfVar17[0x21] = (float)local_58._4_4_ - (float)local_b8._4_4_;
  pfVar17[0x22] = fStack_50 - fStack_b0;
  pfVar17[0x23] = fStack_4c - fStack_ac;
  *(longlong *)(pfVar17 + 0x24) = vgeomID.field_0.v[0];
  *(ulong *)(pfVar17 + 0x26) = CONCAT44(vgeomID.field_0.i[3],vgeomID.field_0.i[2]);
  *(ulong *)(pfVar17 + 0x28) = CONCAT44(vprimID.field_0.i[1],vprimID.field_0.i[0]);
  *(ulong *)(pfVar17 + 0x2a) = CONCAT44(vprimID.field_0.i[3],vprimID.field_0.i[2]);
  aVar24._0_12_ = auVar23._0_12_;
  aVar24.m128[3] = (float)(current->_end - current->_begin);
  (__return_storage_ptr__->ref).ptr = (ulong)pfVar17 | 9;
  (__return_storage_ptr__->bounds).lower.field_0 = aVar24;
  (__return_storage_ptr__->bounds).upper.field_0 = aVar22;
  return __return_storage_ptr__;
}

Assistant:

operator() (const range<unsigned>& current, const FastAllocator::CachedAllocator& alloc)
      {
        vfloat4 lower(pos_inf);
        vfloat4 upper(neg_inf);
        size_t items = current.size();
        size_t start = current.begin();
        assert(items<=4);
        
        /* allocate leaf node */
        Triangle4* accel = (Triangle4*) alloc.malloc1(sizeof(Triangle4),BVH::byteAlignment);
        NodeRef ref = BVH::encodeLeaf((char*)accel,1);
        vuint4 vgeomID = -1, vprimID = -1;
        Vec3vf4 v0 = zero, v1 = zero, v2 = zero;
        const TriangleMesh* __restrict__ const mesh = this->mesh;

        for (size_t i=0; i<items; i++)
        {
          const unsigned int primID = morton[start+i].index;
          const TriangleMesh::Triangle& tri = mesh->triangle(primID);
          const Vec3fa& p0 = mesh->vertex(tri.v[0]);
          const Vec3fa& p1 = mesh->vertex(tri.v[1]);
          const Vec3fa& p2 = mesh->vertex(tri.v[2]);
          lower = min(lower,(vfloat4)p0,(vfloat4)p1,(vfloat4)p2);
          upper = max(upper,(vfloat4)p0,(vfloat4)p1,(vfloat4)p2);
          vgeomID [i] = geomID_;
          vprimID [i] = primID;
          v0.x[i] = p0.x; v0.y[i] = p0.y; v0.z[i] = p0.z;
          v1.x[i] = p1.x; v1.y[i] = p1.y; v1.z[i] = p1.z;
          v2.x[i] = p2.x; v2.y[i] = p2.y; v2.z[i] = p2.z;
        }

        Triangle4::store_nt(accel,Triangle4(v0,v1,v2,vgeomID,vprimID));
        BBox3fx box_o = BBox3fx((Vec3fx)lower,(Vec3fx)upper);
#if ROTATE_TREE
        if (N == 4)
          box_o.lower.a = unsigned(current.size());
#endif
        return NodeRecord(ref,box_o);
      }